

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

void __thiscall QMenu::hideTearOffMenu(QMenu *this)

{
  long lVar1;
  int *piVar2;
  int in_ESI;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  if (((*(long *)(lVar1 + 0x318) != 0) && (*(int *)(*(long *)(lVar1 + 0x318) + 4) != 0)) &&
     (*(long *)(lVar1 + 800) != 0)) {
    QWidget::close(*(QWidget **)(lVar1 + 800),in_ESI);
    piVar2 = *(int **)(lVar1 + 0x318);
    *(undefined8 *)(lVar1 + 0x318) = 0;
    *(undefined8 *)(lVar1 + 800) = 0;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        operator_delete(piVar2);
        return;
      }
    }
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }